

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxgeometsc.hpp
# Opt level: O3

double soplex::computeScalingVec<double>
                 (SVSetBase<double> *vecset,vector<double,_std::allocator<double>_> *coScaleval,
                 vector<double,_std::allocator<double>_> *scaleval,double epsilon)

{
  double dVar1;
  Nonzero<double> *pNVar2;
  double *pdVar3;
  long lVar4;
  Item *pIVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  if ((vecset->set).thenum < 1) {
    dVar8 = 0.0;
  }
  else {
    pdVar3 = (double *)__tls_get_addr(&PTR_003b4b70);
    dVar1 = *pdVar3;
    lVar7 = 0;
    dVar8 = 0.0;
    do {
      pIVar5 = (vecset->set).theitem + (vecset->set).thekey[lVar7].idx;
      ::soplex::infinity::__tls_init();
      lVar4 = (long)(pIVar5->data).super_SVectorBase<double>.memused;
      dVar10 = dVar1;
      if (lVar4 < 1) {
        dVar9 = 0.0;
      }
      else {
        pNVar2 = (pIVar5->data).super_SVectorBase<double>.m_elem;
        dVar9 = 0.0;
        lVar6 = 0;
        do {
          dVar11 = ABS(*(double *)((long)&pNVar2->val + lVar6) *
                       (coScaleval->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[*(uint *)((long)&pNVar2->idx + lVar6)]);
          if (epsilon < dVar11) {
            dVar12 = dVar11;
            if (dVar11 <= dVar9) {
              dVar12 = dVar9;
            }
            dVar9 = dVar12;
            if (dVar11 < dVar10) {
              dVar10 = dVar11;
            }
          }
          lVar6 = lVar6 + 0x10;
        } while (lVar4 * 0x10 != lVar6);
      }
      ::soplex::infinity::__tls_init();
      dVar11 = 1.0;
      dVar12 = 1.0;
      if (dVar10 != dVar1 && dVar9 != 0.0) {
        dVar11 = dVar9;
        dVar12 = dVar10;
      }
      dVar10 = dVar12 * dVar11;
      if (dVar10 < 0.0) {
        dVar10 = sqrt(dVar10);
      }
      else {
        dVar10 = SQRT(dVar10);
      }
      (scaleval->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar7] = 1.0 / dVar10;
      dVar10 = dVar11 / dVar12;
      if (dVar11 / dVar12 <= dVar8) {
        dVar10 = dVar8;
      }
      dVar8 = dVar10;
      lVar7 = lVar7 + 1;
    } while (lVar7 < (vecset->set).thenum);
  }
  return dVar8;
}

Assistant:

static R computeScalingVec(
   const SVSetBase<R>*   vecset, const std::vector<R>& coScaleval,
   std::vector<R>&       scaleval, R epsilon)
{
   R pmax = 0.0;

   assert(scaleval.size() == unsigned(vecset->num()));

   for(int i = 0; i < vecset->num(); ++i)
   {
      const SVectorBase<R>& vec = (*vecset)[i];

      R maxi = 0.0;
      R mini = R(infinity);

      for(int j = 0; j < vec.size(); ++j)
      {
         const R x = spxAbs(vec.value(j) * coScaleval[unsigned(vec.index(j))]);

         if(!isZero(x, epsilon))
         {
            if(x > maxi)
               maxi = x;

            if(x < mini)
               mini = x;
         }
      }

      // empty rows/cols are possible
      if(mini == R(infinity) || maxi == 0.0)
      {
         mini = 1.0;
         maxi = 1.0;
      }

      assert(mini < R(infinity));
      assert(maxi > 0.0);

      scaleval[unsigned(i)] = 1.0 / spxSqrt(mini * maxi);

      const R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}